

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O3

bool __thiscall ON_Brep::RemoveSlits(ON_Brep *this,ON_BrepLoop *L)

{
  int loop_index;
  TYPE TVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  TYPE TVar6;
  uint ti;
  ON_BrepLoop *pOVar7;
  ON_BrepFace *pOVar8;
  ON_BrepLoop *this_00;
  ON_BrepTrim *pOVar9;
  int *piVar10;
  ON_BrepTrim *pOVar11;
  char *sFormat;
  int iVar12;
  TYPE TVar13;
  ON_SimpleArray<int> *this_01;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  int lti1;
  int lti0;
  uint local_70;
  uint local_6c;
  undefined8 local_68;
  ulong local_60;
  ulong local_58;
  ON_BrepTrim *local_50;
  ON_BrepTrim *local_48;
  ulong local_40;
  ON_BrepFace *local_38;
  
  loop_index = L->m_loop_index;
  pOVar7 = Loop(this,loop_index);
  bVar4 = FoundSlitPair(pOVar7,(int *)&local_6c,(int *)&local_70);
  if (bVar4) {
    local_68 = 0;
    while( true ) {
      uVar2 = local_6c;
      uVar16 = local_70;
      pOVar7 = Loop(this,loop_index);
      uVar5 = ON_BrepLoop::TrimCount(pOVar7);
      if (((int)uVar2 < 0) || ((int)uVar5 <= (int)uVar2)) break;
      if (((int)uVar16 < 0) || ((int)uVar5 <= (int)uVar16)) {
        sFormat = "lti1>=0 && lti1<trim_count is false";
        iVar12 = 0xa84;
        goto LAB_0041641d;
      }
      if (uVar2 - uVar16 == 0) {
        sFormat = "lti0!=lti1 is false";
        iVar12 = 0xa85;
        goto LAB_0041641d;
      }
      pOVar8 = ON_BrepLoop::Face(pOVar7);
      if (((loop_index < 0) || (local_38 = pOVar8, pOVar8 == (ON_BrepFace *)0x0)) ||
         ((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count <=
          loop_index)) goto LAB_00416424;
      iVar12 = (int)((uVar2 - uVar16) + uVar5) % (int)uVar5;
      if ((iVar12 == 1) || (iVar12 == uVar5 - 1)) {
        pOVar9 = ON_BrepLoop::Trim(pOVar7,uVar2);
        uVar2 = pOVar9->m_trim_index;
        pOVar9 = ON_BrepLoop::Trim(pOVar7,uVar16);
        uVar16 = pOVar9->m_trim_index;
        ti = PrevTrim(this,uVar2);
        uVar5 = uVar16;
        if (ti == uVar16) {
          ti = PrevTrim(this,uVar16);
          uVar5 = uVar2;
        }
        uVar5 = NextTrim(this,uVar5);
        if ((int)uVar2 < 0) goto LAB_00416424;
        uVar3 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                m_count;
        uVar14 = (ulong)uVar3;
        if ((((int)uVar3 < (int)uVar2) || ((int)uVar16 < 0)) || (uVar3 < uVar16)) goto LAB_00416424;
        pOVar9 = Trim(this,uVar2);
        DeleteTrim(this,pOVar9,true);
        pOVar9 = Trim(this,uVar16);
        DeleteTrim(this,pOVar9,true);
        if (((uVar2 != ti && uVar16 != ti) && -1 < (int)(uVar5 | ti)) &&
           (uVar16 = NextTrim(this,ti), uVar16 == uVar5)) {
          pOVar9 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                   m_a;
          uVar14 = (ulong)(int)uVar5;
          MatchTrimEnds(this,pOVar9 + (int)ti,pOVar9 + uVar14);
          (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])(this,pOVar7,0);
        }
      }
      else {
        TVar6 = pOVar7->m_type;
        if (1 < TVar6 - outer) goto LAB_00416424;
        local_58 = (ulong)uVar5;
        local_40 = (ulong)TVar6;
        pOVar7 = NewLoop(this,TVar6);
        this_00 = Loop(this,loop_index);
        uVar5 = uVar16;
        if (uVar2 >= uVar16 && uVar2 != uVar16) {
          uVar5 = uVar2;
        }
        if (uVar2 < uVar16) {
          uVar16 = uVar2;
        }
        uVar14 = (ulong)uVar16;
        pOVar9 = ON_BrepLoop::Trim(this_00,uVar16);
        local_50 = ON_BrepLoop::Trim(this_00,uVar5);
        pOVar9->m_li = -1;
        local_50->m_li = -1;
        piVar10 = (this_00->m_ti).m_a;
        piVar10[uVar14] = -1;
        piVar10[uVar5] = -1;
        uVar16 = uVar16 + 1;
        local_60 = uVar14;
        local_48 = pOVar9;
        if (uVar16 < uVar5) {
          lVar15 = (ulong)uVar16 << 2;
          do {
            pOVar9 = ON_BrepLoop::Trim(this_00,uVar16);
            ON_SimpleArray<int>::Append(&pOVar7->m_ti,(int *)((long)(this_00->m_ti).m_a + lVar15));
            pOVar9->m_li = pOVar7->m_loop_index;
            piVar10 = (this_00->m_ti).m_a;
            *(undefined4 *)((long)piVar10 + lVar15) = 0xffffffff;
            uVar16 = uVar16 + 1;
            lVar15 = lVar15 + 4;
          } while ((int)uVar16 < (int)uVar5);
        }
        uVar5 = uVar5 + 1;
        uVar14 = local_60 & 0xffffffff;
        if ((int)uVar5 < (int)local_58) {
          lVar15 = 0;
          do {
            piVar10[local_60 + lVar15] = piVar10[(ulong)uVar5 + lVar15];
            lVar15 = lVar15 + 1;
          } while ((int)((int)lVar15 + uVar5) < (int)local_58);
          uVar14 = (ulong)(uint)((int)lVar15 + (int)local_60);
        }
        if ((int)uVar14 <= (this_00->m_ti).m_capacity) {
          (this_00->m_ti).m_count = (int)uVar14;
        }
        pOVar7->m_fi = this_00->m_fi;
        pOVar9 = ON_BrepLoop::Trim(pOVar7,0);
        iVar12 = ON_BrepLoop::TrimCount(pOVar7);
        pOVar11 = ON_BrepLoop::Trim(pOVar7,iVar12 + -1);
        MatchTrimEnds(this,pOVar11,pOVar9);
        iVar12 = ON_BrepLoop::TrimCount(this_00);
        pOVar9 = ON_BrepLoop::Trim(this_00,((int)local_60 + iVar12 + -1) % iVar12);
        pOVar11 = ON_BrepLoop::Trim(this_00,(int)uVar5 % iVar12);
        MatchTrimEnds(this,pOVar9,pOVar11);
        DeleteTrim(this,local_48,true);
        DeleteTrim(this,local_50,true);
        TVar6 = ComputeLoopType(this,this_00);
        this_00->m_type = TVar6;
        TVar6 = ComputeLoopType(this,pOVar7);
        pOVar7->m_type = TVar6;
        (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])(this,this_00,0);
        (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])(this,pOVar7,0);
        pOVar8 = local_38;
        TVar6 = this_00->m_type;
        TVar13 = (TYPE)local_40;
        if (TVar6 == TVar13) {
          TVar1 = pOVar7->m_type;
          uVar14 = (ulong)TVar1;
          if (TVar1 == outer) {
            pOVar8 = NewFace(this,local_38->m_si);
            ON_SimpleArray<int>::Append(&pOVar8->m_li,&pOVar7->m_loop_index);
            pOVar7->m_fi = pOVar8->m_face_index;
          }
          else {
            if (TVar1 != inner) goto LAB_0041627d;
            pOVar7->m_fi = this_00->m_fi;
            ON_SimpleArray<int>::Append(&local_38->m_li,&pOVar7->m_loop_index);
          }
        }
        else {
LAB_0041627d:
          if (TVar13 == outer) {
            if ((TVar6 != inner) || (pOVar7->m_type != outer)) goto LAB_00416424;
            pOVar7->m_fi = this_00->m_fi;
            ON_SimpleArray<int>::Insert(&local_38->m_li,0,&pOVar7->m_loop_index);
          }
          else {
            if (((TVar13 != inner) || (TVar6 != outer)) || (pOVar7->m_type != inner))
            goto LAB_00416424;
            pOVar7->m_fi = this_00->m_fi;
            this_01 = &local_38->m_li;
            ON_SimpleArray<int>::Append(this_01,&pOVar7->m_loop_index);
            iVar12 = ON_BrepFace::LoopCount(pOVar8);
            if (0 < iVar12) {
              lVar15 = 0;
              do {
                if ((pOVar8->m_li).m_a[lVar15] == this_00->m_loop_index) {
                  ON_SimpleArray<int>::Remove(this_01,(int)lVar15);
                  break;
                }
                lVar15 = lVar15 + 1;
                iVar12 = ON_BrepFace::LoopCount(pOVar8);
              } while (lVar15 < iVar12);
            }
            pOVar8 = NewFace(this,pOVar8->m_si);
            ON_SimpleArray<int>::Append(&pOVar8->m_li,&this_00->m_loop_index);
            this_00->m_fi = pOVar8->m_face_index;
          }
        }
        RemoveSlits(this,pOVar7);
      }
      pOVar7 = Loop(this,loop_index);
      bVar4 = FoundSlitPair(pOVar7,(int *)&local_6c,(int *)&local_70);
      local_68 = CONCAT71((int7)(uVar14 >> 8),1);
      if (!bVar4) goto LAB_00416424;
    }
    sFormat = "lti0>=0 && lti0<trim_count is false";
    iVar12 = 0xa83;
LAB_0041641d:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep_tools.cpp"
               ,iVar12,"",sFormat);
  }
  else {
    local_68 = 0;
  }
LAB_00416424:
  pOVar7 = Loop(this,loop_index);
  if ((pOVar7 != (ON_BrepLoop *)0x0) &&
     (pOVar7 = Loop(this,loop_index), (pOVar7->m_ti).m_count == 0)) {
    pOVar7 = Loop(this,loop_index);
    DeleteLoop(this,pOVar7,true);
  }
  return (bool)((byte)local_68 & 1);
}

Assistant:

bool ON_Brep::RemoveSlits(ON_BrepLoop& L)

{
  bool rc = false;
  bool rval = true;
  const int li = L.m_loop_index;

  int lti0, lti1;
  while (rval && FoundSlitPair(*Loop(li), &lti0, &lti1)){ 
    ON_BrepLoop* newloop = nullptr;
		// Warning- This can add a loop and or face causing
		//  reallocation of arrays so refernces (like L) are
		//  no longer valid.
    rval = RemoveSlitPair(*this, li, lti0, lti1, newloop);
    rc = rc || rval;
    if(rval && newloop)
      RemoveSlits(*newloop);
  }

	// 22-Oct-2009 Crash Fix TRR#55897
  if (Loop(li) && Loop(li)->m_ti.Count() == 0) 
    DeleteLoop(*Loop(li), true);
  
  return rc;
}